

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

void * v2i_NAME_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  CONF_VALUE *pCVar2;
  GENERAL_NAME *pGVar3;
  stack_st_GENERAL_SUBTREE *psVar4;
  size_t sVar5;
  undefined1 local_68 [8];
  CONF_VALUE tval;
  CONF_VALUE *val;
  size_t i;
  GENERAL_SUBTREE *sub;
  NAME_CONSTRAINTS *ncons;
  stack_st_GENERAL_SUBTREE **ptree;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  i = 0;
  method_local = (X509V3_EXT_METHOD *)NAME_CONSTRAINTS_new();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
LAB_0076c469:
    NAME_CONSTRAINTS_free((NAME_CONSTRAINTS *)method_local);
    GENERAL_SUBTREE_free((GENERAL_SUBTREE *)i);
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    val = (CONF_VALUE *)0x0;
    while( true ) {
      i = 0;
      pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(nval);
      if (pCVar2 <= val) break;
      tval.value = (char *)sk_CONF_VALUE_value(nval,(size_t)val);
      iVar1 = strncmp(((CONF_VALUE *)tval.value)->name,"permitted",9);
      if ((iVar1 == 0) && (*(char *)(*(long *)(tval.value + 8) + 9) != '\0')) {
        tval.section = (char *)(*(long *)(tval.value + 8) + 10);
        ncons = (NAME_CONSTRAINTS *)method_local;
      }
      else {
        iVar1 = strncmp(*(char **)(tval.value + 8),"excluded",8);
        if ((iVar1 != 0) || (*(char *)(*(long *)(tval.value + 8) + 8) == '\0')) {
          ERR_put_error(0x14,0,0x87,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                        ,0x65);
          goto LAB_0076c469;
        }
        ncons = (NAME_CONSTRAINTS *)&method_local->it;
        tval.section = (char *)(*(long *)(tval.value + 8) + 9);
      }
      tval.name = *(char **)(tval.value + 0x10);
      i = (size_t)GENERAL_SUBTREE_new();
      pGVar3 = v2i_GENERAL_NAME_ex(((GENERAL_SUBTREE *)i)->base,(X509V3_EXT_METHOD *)method,
                                   (X509V3_CTX *)ctx,(CONF_VALUE *)local_68,1);
      if (pGVar3 == (GENERAL_NAME *)0x0) goto LAB_0076c469;
      if (ncons->permittedSubtrees == (stack_st_GENERAL_SUBTREE *)0x0) {
        psVar4 = sk_GENERAL_SUBTREE_new_null();
        ncons->permittedSubtrees = psVar4;
      }
      if ((ncons->permittedSubtrees == (stack_st_GENERAL_SUBTREE *)0x0) ||
         (sVar5 = sk_GENERAL_SUBTREE_push(ncons->permittedSubtrees,(GENERAL_SUBTREE *)i), sVar5 == 0
         )) goto LAB_0076c469;
      val = (CONF_VALUE *)((long)&val->section + 1);
    }
  }
  return method_local;
}

Assistant:

static void *v2i_NAME_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                  const X509V3_CTX *ctx,
                                  const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(GENERAL_SUBTREE) **ptree = NULL;
  NAME_CONSTRAINTS *ncons = NULL;
  GENERAL_SUBTREE *sub = NULL;
  ncons = NAME_CONSTRAINTS_new();
  if (!ncons) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    CONF_VALUE tval;
    if (!strncmp(val->name, "permitted", 9) && val->name[9]) {
      ptree = &ncons->permittedSubtrees;
      tval.name = val->name + 10;
    } else if (!strncmp(val->name, "excluded", 8) && val->name[8]) {
      ptree = &ncons->excludedSubtrees;
      tval.name = val->name + 9;
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SYNTAX);
      goto err;
    }
    tval.value = val->value;
    sub = GENERAL_SUBTREE_new();
    if (!v2i_GENERAL_NAME_ex(sub->base, method, ctx, &tval, 1)) {
      goto err;
    }
    if (!*ptree) {
      *ptree = sk_GENERAL_SUBTREE_new_null();
    }
    if (!*ptree || !sk_GENERAL_SUBTREE_push(*ptree, sub)) {
      goto err;
    }
    sub = NULL;
  }

  return ncons;

err:
  NAME_CONSTRAINTS_free(ncons);
  GENERAL_SUBTREE_free(sub);
  return NULL;
}